

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

void __thiscall
CppGenerator::registerAggregatesToLoops(CppGenerator *this,size_t depth,size_t group_id)

{
  ulong uVar1;
  bool bVar2;
  reference this_00;
  TDNode *pTVar3;
  size_type sVar4;
  long lVar5;
  size_type in_RDX;
  size_type in_RSI;
  undefined8 *puVar6;
  long in_RDI;
  undefined8 *puVar7;
  byte bVar8;
  pair<unsigned_long,_unsigned_long> pVar9;
  size_t *in_stack_000000e0;
  bool *in_stack_000000e8;
  size_t *in_stack_000000f0;
  ProductAggregate *in_stack_000000f8;
  CppGenerator *in_stack_00000100;
  dyn_bitset *in_stack_00000130;
  var_bitset *in_stack_00000138;
  var_bitset *in_stack_00000140;
  dyn_bitset *in_stack_00000148;
  CppGenerator *in_stack_00000150;
  bool loopsOverRelation;
  size_t currentLoop;
  ProductAggregate *prodAgg_1;
  iterator __end1_1;
  iterator __begin1_1;
  value_type *__range1_1;
  size_t j;
  undefined1 in_stack_00000160 [192];
  dyn_bitset *in_stack_00000220;
  dyn_bitset *in_stack_00000228;
  dyn_bitset prefixLoops;
  dyn_bitset nextVariable;
  dyn_bitset consideredLoops;
  pair<unsigned_long,_unsigned_long> *p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *__range2;
  ProductAggregate *prodAgg;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  dyn_bitset contributingViews;
  prod_bitset presentFunctions;
  var_bitset *relationBag;
  size_t maxDepth;
  var_bitset *varOrderBitset;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffa78;
  undefined7 in_stack_fffffffffffffa80;
  undefined1 in_stack_fffffffffffffa87;
  allocator<unsigned_long> *in_stack_fffffffffffffa88;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffa90;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffa98;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffaa0;
  pair<unsigned_long,_unsigned_long> local_3e8;
  undefined1 local_3d1;
  undefined8 local_3d0;
  reference local_3c8;
  ProductAggregate *local_3c0;
  __normal_iterator<ProductAggregate_*,_std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>
  local_3b8;
  reference local_3b0;
  ulong local_388;
  undefined8 local_2a0 [39];
  reference local_168;
  pair<unsigned_long,_unsigned_long> *local_160;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_158;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *local_150;
  reference local_148;
  ProductAggregate *local_140;
  __normal_iterator<ProductAggregate_*,_std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>
  local_138;
  reference local_130;
  undefined1 local_f0 [192];
  bitset<100UL> *local_30;
  size_type local_28;
  reference local_20;
  size_type local_18;
  size_type local_10;
  
  bVar8 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::operator[]
                       ((vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *)
                        (in_RDI + 0xd0),in_RDX);
  local_28 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        (*(long *)(in_RDI + 0xb8) + local_18 * 0x18));
  std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2b7c9b);
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2b7cbc);
  this_00 = std::
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          *)(in_RDI + 0xf0),local_18);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this_00,0);
  QueryCompiler::getView
            ((QueryCompiler *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
             (size_t)in_stack_fffffffffffffa78);
  pTVar3 = TreeDecomposition::getRelation
                     ((TreeDecomposition *)
                      CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                      (size_t)in_stack_fffffffffffffa78);
  local_30 = &pTVar3->_bag;
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *)0x2b7d36);
  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::clear
            ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)0x2b7d4a);
  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::clear
            ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)0x2b7d5e);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *)0x2b7d72);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *)0x2b7d86);
  std::bitset<1500UL>::bitset((bitset<1500UL> *)0x2b7d93);
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2b7da0);
  QueryCompiler::numberOfViews((QueryCompiler *)0x2b7da8);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2b7dc8);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98,
             (unsigned_long)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2b7dfc);
  local_130 = std::
              vector<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
              ::operator[]((vector<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
                            *)(in_RDI + 0x370),local_10);
  local_138._M_current =
       (ProductAggregate *)
       std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>::begin
                 ((vector<ProductAggregate,_std::allocator<ProductAggregate>_> *)
                  in_stack_fffffffffffffa78);
  local_140 = (ProductAggregate *)
              std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>::end
                        ((vector<ProductAggregate,_std::allocator<ProductAggregate>_> *)
                         in_stack_fffffffffffffa78);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<ProductAggregate_*,_std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>
                        *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                       (__normal_iterator<ProductAggregate_*,_std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>
                        *)in_stack_fffffffffffffa78);
    if (!bVar2) break;
    local_148 = __gnu_cxx::
                __normal_iterator<ProductAggregate_*,_std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>
                ::operator*(&local_138);
    std::bitset<1500UL>::operator|=
              ((bitset<1500UL> *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
               (bitset<1500UL> *)in_stack_fffffffffffffa78);
    local_150 = &local_148->viewAggregate;
    local_158._M_current =
         (pair<unsigned_long,_unsigned_long> *)
         std::
         vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ::begin((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  *)in_stack_fffffffffffffa78);
    local_160 = (pair<unsigned_long,_unsigned_long> *)
                std::
                vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ::end((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       *)in_stack_fffffffffffffa78);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                         (__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                          *)in_stack_fffffffffffffa78);
      if (!bVar2) break;
      local_168 = __gnu_cxx::
                  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                  ::operator*(&local_158);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                (in_stack_fffffffffffffa90,(size_type)in_stack_fffffffffffffa88,
                 (bool)in_stack_fffffffffffffa87);
      __gnu_cxx::
      __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
      ::operator++(&local_158);
    }
    __gnu_cxx::
    __normal_iterator<ProductAggregate_*,_std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>
    ::operator++(&local_138);
  }
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2b7f99);
  QueryCompiler::numberOfViews((QueryCompiler *)0x2b7fa1);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2b7fd3);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98,
             (unsigned_long)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2b8003);
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2b8014);
  QueryCompiler::numberOfViews((QueryCompiler *)0x2b801c);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2b804e);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98,
             (unsigned_long)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2b807e);
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2b808f);
  QueryCompiler::numberOfViews((QueryCompiler *)0x2b8097);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2b80c9);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98,
             (unsigned_long)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2b80f9);
  memcpy(local_2a0,local_f0,0xc0);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),in_stack_fffffffffffffa78
            );
  puVar6 = local_2a0;
  puVar7 = (undefined8 *)&stack0xfffffffffffffa78;
  for (lVar5 = 0x18; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar7 = *puVar6;
    puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
    puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
  }
  computeLoopMasks(in_stack_00000150,(prod_bitset)in_stack_00000160,in_stack_00000148,
                   in_stack_00000140,in_stack_00000138,in_stack_00000130,in_stack_00000220,
                   in_stack_00000228);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b81b2);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::operator[]((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)(in_RDI + 0x598),0);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator|=
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  local_388 = 1;
  while( true ) {
    uVar1 = local_388;
    sVar4 = std::
            vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::size((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)(in_RDI + 0x598));
    if (sVar4 <= uVar1) break;
    std::
    vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator[]((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)(in_RDI + 0x598),local_388);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
              (in_stack_fffffffffffffa98);
    std::
    vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator[]((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)(in_RDI + 0x598),0);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator&=
              (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b8285);
    local_388 = local_388 + 1;
  }
  std::
  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
  ::clear((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
           *)0x2b83c3);
  std::
  vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
  ::clear((vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
           *)0x2b83d7);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::size((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *)(in_RDI + 0x550));
  std::
  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
  ::resize((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
            *)in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::size((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *)(in_RDI + 0x550));
  std::
  vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
  ::resize((vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
            *)in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98);
  std::
  vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
  ::clear((vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
           *)0x2b8448);
  std::
  vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
  ::clear((vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
           *)0x2b8464);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::size((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *)(in_RDI + 0x550));
  std::
  vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
  ::resize((vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
            *)in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::size((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *)(in_RDI + 0x550));
  std::
  vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
  ::resize((vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
            *)in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98);
  std::
  vector<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
  ::clear((vector<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
           *)0x2b84d5);
  std::
  vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
  ::clear((vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
           *)0x2b84f1);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::size((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *)(in_RDI + 0x550));
  std::
  vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
  ::resize((vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
            *)in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::size((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *)(in_RDI + 0x550));
  std::
  vector<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
  ::resize((vector<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
            *)in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98);
  local_3b0 = std::
              vector<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
              ::operator[]((vector<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
                            *)(in_RDI + 0x370),local_10);
  local_3b8._M_current =
       (ProductAggregate *)
       std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>::begin
                 ((vector<ProductAggregate,_std::allocator<ProductAggregate>_> *)
                  in_stack_fffffffffffffa78);
  local_3c0 = (ProductAggregate *)
              std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>::end
                        ((vector<ProductAggregate,_std::allocator<ProductAggregate>_> *)
                         in_stack_fffffffffffffa78);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<ProductAggregate_*,_std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>
                        *)CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                       (__normal_iterator<ProductAggregate_*,_std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>
                        *)in_stack_fffffffffffffa78);
    if (!bVar2) break;
    local_3c8 = __gnu_cxx::
                __normal_iterator<ProductAggregate_*,_std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>
                ::operator*(&local_3b8);
    local_3d0 = 0;
    local_3d1 = 0;
    pVar9 = addProductToLoop(in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000e8
                             ,in_stack_000000e0);
    local_3e8 = pVar9;
    std::pair<unsigned_long,_unsigned_long>::operator=(&local_3c8->correspondingLoopAgg,&local_3e8);
    __gnu_cxx::
    __normal_iterator<ProductAggregate_*,_std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>
    ::operator++(&local_3b8);
  }
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b867d);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b868a);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b8697);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b86a4);
  return;
}

Assistant:

void CppGenerator::registerAggregatesToLoops(size_t depth, size_t group_id)
{
    const var_bitset& varOrderBitset = groupVariableOrderBitset[group_id];
    const size_t maxDepth = groupVariableOrder[group_id].size();
    const var_bitset& relationBag =
        _td->getRelation(_qc->getView(viewGroups[group_id][0])->_origin)->_bag;

    listOfLoops.clear();
    functionsPerLoop.clear();
    functionsPerLoopBranch.clear();
    viewsPerLoop.clear();
    nextLoopsPerLoop.clear();

    // go through the ProductAggregates and find functions computed here 
    prod_bitset presentFunctions;    
    dyn_bitset contributingViews(_qc->numberOfViews()+1);
    for (const ProductAggregate& prodAgg : productToVariableRegister[depth])
    {
        presentFunctions |= prodAgg.product;
        for (const std::pair<size_t,size_t>& p : prodAgg.viewAggregate)
            contributingViews.set(p.first);
    }

    /*************** PRINT OUT **************/
    // const TDNode& node =
    //     *_td->getRelation(_qc->getView(viewGroups[group_id][0])->_origin);
    // std::cout << genProductString(node,contributingViews,presentFunctions)<<std::endl;
    /*************** PRINT OUT **************/
    
    dyn_bitset consideredLoops(_qc->numberOfViews()+1);
    dyn_bitset nextVariable(_qc->numberOfViews()+1);
    dyn_bitset prefixLoops(_qc->numberOfViews()+1);

    // compute the function mask for each loop 
    computeLoopMasks(presentFunctions, consideredLoops, varOrderBitset,
                     relationBag, contributingViews, nextVariable, prefixLoops);

    
    // The first register loop should all views that we do not iterate over! 
    viewsPerLoop[0] |= contributingViews;
    for (size_t j = 1; j < viewsPerLoop.size(); ++j)
        viewsPerLoop[0] &= ~viewsPerLoop[j];
    
    newAggregateRegister.clear();
    aggregateRegisterMap.clear();
    newAggregateRegister.resize(listOfLoops.size());
    aggregateRegisterMap.resize(listOfLoops.size());

    localProductMap.clear();
    localProductList.clear();
    localProductList.resize(listOfLoops.size());
    localProductMap.resize(listOfLoops.size());

    viewProductMap.clear();
    viewProductList.clear();
    viewProductList.resize(listOfLoops.size());
    viewProductMap.resize(listOfLoops.size());
    
    for(ProductAggregate& prodAgg : productToVariableRegister[depth])
    {    
        size_t currentLoop = 0;
        bool loopsOverRelation = false;
        prodAgg.correspondingLoopAgg =
            addProductToLoop(prodAgg, currentLoop, loopsOverRelation, maxDepth);
    }
}